

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test7::setInputAttributeValues(GPUShaderFP64Test7 *this,_variables *variables)

{
  _variable_type type;
  int iVar1;
  uint uVar2;
  uint uVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  uint uVar6;
  char *msg;
  pointer p_Var7;
  double data [4];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar5;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  p_Var7 = (variables->
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (p_Var7 != (variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      type = p_Var7->type;
      uVar2 = Utils::getNumberOfComponentsForVariableType(type);
      uVar3 = 1;
      if (((byte)(0x7fc03fe0 >> ((byte)type & 0x1f)) & type < VARIABLE_TYPE_UINT) == 1) {
        uVar3 = Utils::getNumberOfColumnsForVariableType(p_Var7->type);
        uVar2 = uVar2 / uVar3;
      }
      if (p_Var7->array_size * uVar3 != 0) {
        uVar6 = 0;
        do {
          local_48 = 0xbff0000000000000;
          uStack_40 = 0xbff0000000000000;
          local_58 = 0;
          uStack_54 = 0xbff00000;
          uStack_50 = 0;
          uStack_4c = 0xbff00000;
          switch(uVar2) {
          case 1:
            (**(code **)(lVar5 + 0x1968))(p_Var7->attribute_location + uVar6,&local_58);
            dVar4 = (**(code **)(lVar5 + 0x800))();
            msg = "glVertexAttrib1dv() call failed.";
            iVar1 = 0x2873;
            break;
          case 2:
            (**(code **)(lVar5 + 0x1978))(p_Var7->attribute_location + uVar6,&local_58);
            dVar4 = (**(code **)(lVar5 + 0x800))();
            msg = "glVertexAttrib2dv() call failed.";
            iVar1 = 0x287b;
            break;
          case 3:
            (**(code **)(lVar5 + 0x1988))(p_Var7->attribute_location + uVar6,&local_58);
            dVar4 = (**(code **)(lVar5 + 0x800))();
            msg = "glVertexAttrib3dv() call failed.";
            iVar1 = 0x2883;
            break;
          case 4:
            (**(code **)(lVar5 + 0x1998))(p_Var7->attribute_location + uVar6,&local_58);
            dVar4 = (**(code **)(lVar5 + 0x800))();
            msg = "glVertexAttrib4dv() call failed.";
            iVar1 = 0x288b;
            break;
          default:
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unrecognized number of components",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0x2892);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          glu::checkError(dVar4,msg,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,iVar1);
          (**(code **)(lVar5 + 0x518))(p_Var7->attribute_location + uVar6);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"glDisableVertexAttribArray() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x2898);
          uVar6 = uVar6 + 1;
        } while (uVar6 < p_Var7->array_size * uVar3);
      }
      p_Var7 = p_Var7 + 1;
    } while (p_Var7 != (variables->
                       super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GPUShaderFP64Test7::setInputAttributeValues(const _variables& variables)
{
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();
	unsigned int		  counter = 6;

	for (_variables_const_iterator variable_iterator = variables.begin(); variable_iterator != variables.end();
		 variable_iterator++)
	{
		const _variable&   variable			  = *variable_iterator;
		const bool		   is_matrix_type	 = Utils::isMatrixVariableType(variable.type);
		const unsigned int n_total_components = Utils::getNumberOfComponentsForVariableType(variable.type);
		unsigned int	   n_components		  = 0;
		unsigned int	   n_columns		  = 1;

		if (is_matrix_type)
		{
			n_columns	= Utils::getNumberOfColumnsForVariableType(variable.type);
			n_components = n_total_components / n_columns;

			DE_ASSERT(n_total_components % n_columns == 0);
		}
		else
		{
			n_components = n_total_components;
		}

		DE_ASSERT(n_components >= 1 && n_components <= 4);

		for (unsigned int index = 0; index < n_columns * variable.array_size; ++index)
		{
			const double data[] = { -1, -1, -1, -1 };

			switch (n_components)
			{
			case 1:
			{
				gl.vertexAttribL1dv(variable.attribute_location + index, data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttrib1dv() call failed.");

				break;
			}

			case 2:
			{
				gl.vertexAttribL2dv(variable.attribute_location + index, data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttrib2dv() call failed.");

				break;
			}

			case 3:
			{
				gl.vertexAttribL3dv(variable.attribute_location + index, data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttrib3dv() call failed.");

				break;
			}

			case 4:
			{
				gl.vertexAttribL4dv(variable.attribute_location + index, data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttrib4dv() call failed.");

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized number of components");
			}
			} /* switch (n_components) */

			/* Make sure VAAs are disabled */
			gl.disableVertexAttribArray(variable.attribute_location + index);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDisableVertexAttribArray() call failed.");

			counter += n_components;
		} /* for (all array indices) */
	}	 /* for (all variables) */
}